

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Query_PDU::SetSensorTypes
          (Minefield_Query_PDU *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *ST)

{
  size_type sVar1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *ST_local;
  Minefield_Query_PDU *this_local;
  
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength +
       (ushort)this->m_ui8NumSensTyp * -2;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
            (&this->m_vui16SensorTypes,ST);
  sVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    (&this->m_vui16SensorTypes);
  this->m_ui8NumSensTyp = (KUINT8)sVar1;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength +
       (ushort)this->m_ui8NumSensTyp * 2;
  calcPadding(this);
  return;
}

Assistant:

void Minefield_Query_PDU::SetSensorTypes( const vector<KUINT16> & ST )
{
    // Subtract old values from pdu length.
    m_ui16PDULength -= m_ui8NumSensTyp * 2; // 2 = size of sensor type.

    m_vui16SensorTypes = ST;
    m_ui8NumSensTyp = m_vui16SensorTypes.size();

    // Calculate the new size
    m_ui16PDULength += m_ui8NumSensTyp * 2;
    calcPadding();
}